

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTRuntimeInfoTracker.cpp
# Opt level: O2

void __thiscall
TTD::RuntimeContextInfo::GatherKnownObjectToPathMap(RuntimeContextInfo *this,ScriptContext *ctx)

{
  TTAutoString *nullString;
  Type pPVar1;
  bool bVar2;
  int iVar3;
  BOOL BVar4;
  RecyclableObject *pRVar5;
  JavascriptFunction *pJVar6;
  Type *ppPVar7;
  RecyclableObject *pRVar8;
  DynamicObject *this_00;
  ArrayObject *val;
  char *msg;
  int index;
  undefined1 local_78 [8];
  List<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  propertyRecordList;
  Var pitem;
  Var getter;
  Var setter;
  
  propertyRecordList.
  super_ReadOnlyList<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_DefaultComparer>._16_8_ =
       &Memory::HeapAllocator::Instance;
  local_78 = (undefined1  [8])&PTR_IsReadOnly_01382b28;
  propertyRecordList.
  super_ReadOnlyList<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_DefaultComparer>.
  _vptr_ReadOnlyList = (_func_int **)0x0;
  propertyRecordList.
  super_ReadOnlyList<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_DefaultComparer>.buffer.
  _0_4_ = 0;
  propertyRecordList.
  super_ReadOnlyList<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_DefaultComparer>.alloc =
       (Type)0x400000000;
  EnqueueRootPathObject
            (this,L"global",(RecyclableObject *)(ctx->super_ScriptContextBase).globalObject);
  EnqueueRootPathObject
            (this,L"null",
             (((ctx->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
             nullValue.ptr);
  pRVar5 = Js::VarTo<Js::RecyclableObject>
                     ((((ctx->super_ScriptContextBase).javascriptLibrary)->undeclBlockVarSentinel).
                      ptr);
  EnqueueRootPathObject(this,L"undeclBlockVar",pRVar5);
  EnqueueRootPathObject
            (this,L"_defaultAccessor",
             (RecyclableObject *)
             (((ctx->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
             defaultAccessorFunction.ptr);
  if (((ctx->config).threadConfig)->m_errorStackTrace == true) {
    EnqueueRootPathObject
              (this,L"_stackTraceAccessor",
               (RecyclableObject *)
               (((ctx->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
               stackTraceAccessorFunction.ptr);
  }
  EnqueueRootPathObject
            (this,L"_throwTypeErrorRestrictedPropertyAccessor",
             (RecyclableObject *)
             (((ctx->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
             throwTypeErrorRestrictedPropertyAccessorFunction.ptr);
  EnqueueRootPathObject
            (this,L"_identityFunction",
             (RecyclableObject *)
             (((ctx->super_ScriptContextBase).javascriptLibrary)->identityFunction).ptr);
  EnqueueRootPathObject
            (this,L"_throwerFunction",
             (RecyclableObject *)
             (((ctx->super_ScriptContextBase).javascriptLibrary)->throwerFunction).ptr);
  bVar2 = Js::ScriptContext::IsJsBuiltInEnabled(ctx);
  if (bVar2) {
    Js::JavascriptLibrary::EnsureArrayBuiltInsAreReady
              ((ctx->super_ScriptContextBase).javascriptLibrary);
  }
  EnqueueRootPathObject
            (this,L"_arrayIteratorPrototype",
             &((((ctx->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
               arrayIteratorPrototype.ptr)->super_RecyclableObject);
  EnqueueRootPathObject
            (this,L"_mapIteratorPrototype",
             &((((ctx->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
               mapIteratorPrototype.ptr)->super_RecyclableObject);
  EnqueueRootPathObject
            (this,L"_setIteratorPrototype",
             &((((ctx->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
               setIteratorPrototype.ptr)->super_RecyclableObject);
  EnqueueRootPathObject
            (this,L"_stringIteratorPrototype",
             &((((ctx->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
               stringIteratorPrototype.ptr)->super_RecyclableObject);
  pJVar6 = Js::JavascriptLibrary::EnsureGeneratorNextFunction
                     ((ctx->super_ScriptContextBase).javascriptLibrary);
  EnqueueRootPathObject(this,L"_generatorNextFunction",(RecyclableObject *)pJVar6);
  pJVar6 = Js::JavascriptLibrary::EnsureGeneratorReturnFunction
                     ((ctx->super_ScriptContextBase).javascriptLibrary);
  EnqueueRootPathObject(this,L"_generatorReturnFunction",(RecyclableObject *)pJVar6);
  pJVar6 = Js::JavascriptLibrary::EnsureGeneratorThrowFunction
                     ((ctx->super_ScriptContextBase).javascriptLibrary);
  EnqueueRootPathObject(this,L"_generatorThrowFunction",(RecyclableObject *)pJVar6);
  EnqueueRootPathObject
            (this,L"_generatorFunctionConstructor",
             (RecyclableObject *)
             (((ctx->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
             generatorFunctionConstructor.ptr);
  EnqueueRootPathObject
            (this,L"_asyncFunctionConstructor",
             (RecyclableObject *)
             (((ctx->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
             asyncFunctionConstructor.ptr);
  do {
    if ((RuntimeContextInfo *)
        (this->m_worklist).list.super_DListBase<Js::RecyclableObject_*,_RealCount>.
        super_DListNodeBase<Js::RecyclableObject_*>.next.base == this) {
      nullString = &this->m_nullString;
      SortDictIntoListOnNames<Js::RecyclableObject*>
                (&this->m_coreObjToPathMap,&this->m_sortedObjectList,nullString);
      SortDictIntoListOnNames<Js::FunctionBody*>
                (&this->m_coreBodyToPathMap,&this->m_sortedFunctionBodyList,nullString);
      SortDictIntoListOnNames<Js::DebuggerScope*>
                (&this->m_coreDbgScopeToPathMap,&this->m_sortedDbgScopeList,nullString);
      JsUtil::
      List<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
      ::~List((List<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               *)local_78);
      return;
    }
    pRVar5 = JsUtil::Queue<Js::RecyclableObject_*,_Memory::HeapAllocator>::Dequeue
                       (&this->m_worklist);
    propertyRecordList.
    super_ReadOnlyList<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_DefaultComparer>.buffer.
    _0_4_ = 0;
    LoadAndOrderPropertyNames
              (pRVar5,(List<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                       *)local_78);
    for (index = 0;
        index < (int)propertyRecordList.
                     super_ReadOnlyList<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_DefaultComparer>
                     .buffer; index = index + 1) {
      ppPVar7 = JsUtil::
                List<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item((List<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                        *)local_78,index);
      pPVar1 = *ppPVar7;
      pitem = (Var)0x0;
      getter = (Var)0x0;
      iVar3 = (*(pRVar5->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x15])(pRVar5,(ulong)(uint)pPVar1->pid,&pitem,&getter);
      if (iVar3 == 0) {
        propertyRecordList._40_8_ = 0;
        BVar4 = Js::JavascriptOperators::GetOwnProperty
                          (pRVar5,pPVar1->pid,(Var *)&propertyRecordList.field_0x28,ctx,
                           (PropertyValueInfo *)0x0);
        if (BVar4 == 0) {
          TTDAbort_unrecoverable_error("Not sure what went wrong.");
        }
        EnqueueNewPathVarAsNeeded
                  (this,pRVar5,(Var)propertyRecordList._40_8_,(char16 *)(pPVar1 + 1),(char16 *)0x0);
      }
      else {
        if (pitem != (Var)0x0) {
          BVar4 = Js::JavascriptOperators::IsUndefinedObject(pitem);
          if (BVar4 == 0) {
            bVar2 = Js::VarIs<Js::JavascriptFunction>(pitem);
            if (!bVar2) {
              msg = "The getter is not a function?";
              goto LAB_0082906c;
            }
            EnqueueNewPathVarAsNeeded(this,pRVar5,pitem,(char16 *)(pPVar1 + 1),L">");
          }
        }
        if (getter != (Var)0x0) {
          BVar4 = Js::JavascriptOperators::IsUndefinedObject(getter);
          if (BVar4 == 0) {
            bVar2 = Js::VarIs<Js::JavascriptFunction>(getter);
            if (!bVar2) {
              msg = "The setter is not a function?";
LAB_0082906c:
              TTDAbort_unrecoverable_error(msg);
            }
            pRVar8 = Js::VarTo<Js::RecyclableObject>(getter);
            EnqueueNewPathVarAsNeeded(this,pRVar5,pRVar8,(char16 *)(pPVar1 + 1),L"<");
          }
        }
      }
    }
    bVar2 = Js::DynamicType::Is(((pRVar5->type).ptr)->typeId);
    if (bVar2) {
      this_00 = Js::VarTo<Js::DynamicObject,Js::RecyclableObject>(pRVar5);
      val = Js::DynamicObject::GetObjectArray(this_00);
      if (val != (ArrayObject *)0x0) {
        EnqueueNewPathVarAsNeeded(this,pRVar5,val,L"_object_array_",(char16 *)0x0);
      }
    }
    pRVar8 = Js::RecyclableObject::GetPrototype(pRVar5);
    if (pRVar8 != (RecyclableObject *)0x0) {
      BVar4 = Js::JavascriptOperators::IsUndefinedOrNullType(((pRVar8->type).ptr)->typeId);
      if (BVar4 == 0) {
        EnqueueNewPathVarAsNeeded(this,pRVar5,pRVar8,L"_proto_",(char16 *)0x0);
      }
    }
    (*(pRVar5->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
      [0x5e])(pRVar5);
  } while( true );
}

Assistant:

void RuntimeContextInfo::GatherKnownObjectToPathMap(Js::ScriptContext* ctx)
    {
        JsUtil::List<const Js::PropertyRecord*, HeapAllocator> propertyRecordList(&HeapAllocator::Instance);

        this->EnqueueRootPathObject(_u("global"), ctx->GetGlobalObject());
        this->EnqueueRootPathObject(_u("null"), ctx->GetLibrary()->GetNull());
        this->EnqueueRootPathObject(_u("undeclBlockVar"), Js::VarTo<Js::RecyclableObject>(ctx->GetLibrary()->GetUndeclBlockVar()));

        this->EnqueueRootPathObject(_u("_defaultAccessor"), ctx->GetLibrary()->GetDefaultAccessorFunction());

        if(ctx->GetConfig()->IsErrorStackTraceEnabled())
        {
            this->EnqueueRootPathObject(_u("_stackTraceAccessor"), ctx->GetLibrary()->GetStackTraceAccessorFunction());
        }

        this->EnqueueRootPathObject(_u("_throwTypeErrorRestrictedPropertyAccessor"), ctx->GetLibrary()->GetThrowTypeErrorRestrictedPropertyAccessorFunction());

        this->EnqueueRootPathObject(_u("_identityFunction"), ctx->GetLibrary()->GetIdentityFunction());
        this->EnqueueRootPathObject(_u("_throwerFunction"), ctx->GetLibrary()->GetThrowerFunction());

       // ArrayIteratorPrototype is not created when we have JsBuiltins, it it created on-demand only
#ifdef ENABLE_JS_BUILTINS
        if (ctx->IsJsBuiltInEnabled())
        {
            ctx->GetLibrary()->EnsureArrayBuiltInsAreReady();
        }
#endif
        this->EnqueueRootPathObject(_u("_arrayIteratorPrototype"), ctx->GetLibrary()->GetArrayIteratorPrototype());
        this->EnqueueRootPathObject(_u("_mapIteratorPrototype"), ctx->GetLibrary()->GetMapIteratorPrototype());
        this->EnqueueRootPathObject(_u("_setIteratorPrototype"), ctx->GetLibrary()->GetSetIteratorPrototype());
        this->EnqueueRootPathObject(_u("_stringIteratorPrototype"), ctx->GetLibrary()->GetStringIteratorPrototype());

        this->EnqueueRootPathObject(_u("_generatorNextFunction"), ctx->GetLibrary()->EnsureGeneratorNextFunction());
        this->EnqueueRootPathObject(_u("_generatorReturnFunction"), ctx->GetLibrary()->EnsureGeneratorReturnFunction());
        this->EnqueueRootPathObject(_u("_generatorThrowFunction"), ctx->GetLibrary()->EnsureGeneratorThrowFunction());
        this->EnqueueRootPathObject(_u("_generatorFunctionConstructor"), ctx->GetLibrary()->GetGeneratorFunctionConstructor());
        this->EnqueueRootPathObject(_u("_asyncFunctionConstructor"), ctx->GetLibrary()->GetAsyncFunctionConstructor());

        uint32 counter = 0;
        while(!this->m_worklist.Empty())
        {
            Js::RecyclableObject* curr = this->m_worklist.Dequeue();

            counter++;

            ////
            //Handle the standard properties for all object types

            //load propArray with all property names
            propertyRecordList.Clear();
            LoadAndOrderPropertyNames(curr, propertyRecordList);

            //access each property and process the target objects as needed
            for(int32 i = 0; i < propertyRecordList.Count(); ++i)
            {
                const Js::PropertyRecord* precord = propertyRecordList.Item(i);

                Js::Var getter = nullptr;
                Js::Var setter = nullptr;
                if(curr->GetAccessors(precord->GetPropertyId(), &getter, &setter, ctx))
                {
                    if(getter != nullptr && !Js::JavascriptOperators::IsUndefinedObject(getter))
                    {
                        TTDAssert(Js::VarIs<Js::JavascriptFunction>(getter), "The getter is not a function?");
                        this->EnqueueNewPathVarAsNeeded(curr, getter, precord, _u(">"));
                    }

                    if(setter != nullptr && !Js::JavascriptOperators::IsUndefinedObject(setter))
                    {
                        TTDAssert(Js::VarIs<Js::JavascriptFunction>(setter), "The setter is not a function?");
                        this->EnqueueNewPathVarAsNeeded(curr, Js::VarTo<Js::RecyclableObject>(setter), precord, _u("<"));
                    }
                }
                else
                {
                    Js::Var pitem = nullptr;
                    BOOL isproperty = Js::JavascriptOperators::GetOwnProperty(curr, precord->GetPropertyId(), &pitem, ctx, nullptr);
                    TTDAssert(isproperty, "Not sure what went wrong.");

                    this->EnqueueNewPathVarAsNeeded(curr, pitem, precord, nullptr);
                }
            }

            //shouldn't have any dynamic array valued properties
            if(Js::DynamicType::Is(curr->GetTypeId()))
            {
                Js::ArrayObject* parray = Js::VarTo<Js::DynamicObject>(curr)->GetObjectArray();
                if(parray != nullptr)
                {
                    this->EnqueueNewPathVarAsNeeded(curr, parray, _u("_object_array_"));
                }
            }

            Js::RecyclableObject* proto = curr->GetPrototype();
            bool skipProto = (proto == nullptr) || Js::JavascriptOperators::IsUndefinedOrNullType(proto->GetTypeId());
            if(!skipProto)
            {
                this->EnqueueNewPathVarAsNeeded(curr, proto, _u("_proto_"));
            }

            curr->ProcessCorePaths();
        }

        SortDictIntoListOnNames<Js::RecyclableObject*>(this->m_coreObjToPathMap, this->m_sortedObjectList, this->m_nullString);
        SortDictIntoListOnNames<Js::FunctionBody*>(this->m_coreBodyToPathMap, this->m_sortedFunctionBodyList, this->m_nullString);
        SortDictIntoListOnNames<Js::DebuggerScope*>(this->m_coreDbgScopeToPathMap, this->m_sortedDbgScopeList, this->m_nullString);
    }